

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::SSLClient::SSLClient
          (SSLClient *this,string *host,int port,string *client_cert_path,string *client_key_path)

{
  char *b;
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *pSVar2;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  ClientImpl::ClientImpl(&this->super_ClientImpl,host,port,client_cert_path,client_key_path);
  (this->super_ClientImpl)._vptr_ClientImpl = (_func_int **)&PTR__SSLClient_001a01c8;
  (this->ctx_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ctx_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->ctx_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->ctx_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->ctx_mutex_).super___mutex_base._M_mutex.__data.__list.__prev + 4) =
       0;
  *(undefined8 *)((long)&(this->ctx_mutex_).super___mutex_base._M_mutex.__data.__list.__next + 4) =
       0;
  (this->host_components_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->host_components_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->host_components_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->verify_result_ = 0;
  meth = (SSL_METHOD *)TLS_client_method();
  pSVar2 = SSL_CTX_new(meth);
  this->ctx_ = (SSL_CTX *)pSVar2;
  b = (this->super_ClientImpl).host_._M_dataplus._M_p;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7503:13)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7503:13)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  detail::split(b,b + (this->super_ClientImpl).host_._M_string_length,'.',
                (function<void_(const_char_*,_const_char_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((client_cert_path->_M_string_length != 0) && (client_key_path->_M_string_length != 0)) {
    iVar1 = SSL_CTX_use_certificate_file
                      ((SSL_CTX *)this->ctx_,(client_cert_path->_M_dataplus)._M_p,1);
    if ((iVar1 == 1) &&
       (iVar1 = SSL_CTX_use_PrivateKey_file
                          ((SSL_CTX *)this->ctx_,(client_key_path->_M_dataplus)._M_p,1), iVar1 == 1)
       ) {
      return;
    }
    SSL_CTX_free((SSL_CTX *)this->ctx_);
    this->ctx_ = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

inline SSLClient::SSLClient(const std::string & host, int port,
        const std::string & client_cert_path,
        const std::string & client_key_path)
        : ClientImpl(host, port, client_cert_path, client_key_path) {
        ctx_ = SSL_CTX_new(TLS_client_method());

        detail::split(&host_[0], &host_[host_.size()], '.',
            [&](const char* b, const char* e) {
            host_components_.emplace_back(std::string(b, e));
        });

        if (!client_cert_path.empty() && !client_key_path.empty()) {
            if (SSL_CTX_use_certificate_file(ctx_, client_cert_path.c_str(),
                SSL_FILETYPE_PEM) != 1 ||
                SSL_CTX_use_PrivateKey_file(ctx_, client_key_path.c_str(),
                    SSL_FILETYPE_PEM) != 1) {
                SSL_CTX_free(ctx_);
                ctx_ = nullptr;
            }
        }
    }